

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBase.cpp
# Opt level: O0

Vector<int,_std::allocator<int>_> *
amrex::InterpBase::GetBCArray(Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr)

{
  Long LVar1;
  BCRec *pBVar2;
  int *piVar3;
  Vector<int,_std::allocator<int>_> *in_RDI;
  int m;
  int *b_rec;
  int n;
  Vector<int,_std::allocator<int>_> *bc;
  size_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_3c;
  int local_30;
  
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::size
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x106905a);
  std::allocator<int>::allocator((allocator<int> *)0x1069075);
  Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
             ,(allocator_type *)0x1069089);
  std::allocator<int>::~allocator((allocator<int> *)0x1069095);
  for (local_30 = 0;
      LVar1 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::size
                        ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x10690b1),
      local_30 < LVar1; local_30 = local_30 + 1) {
    pBVar2 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                       ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
    for (local_3c = 0; local_3c < 6; local_3c = local_3c + 1) {
      in_stack_ffffffffffffff94 = pBVar2->bc[local_3c];
      piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
      *piVar3 = in_stack_ffffffffffffff94;
    }
  }
  return in_RDI;
}

Assistant:

Vector<int>
InterpBase::GetBCArray (const Vector<BCRec>& bcr)
{
    Vector<int> bc(2*AMREX_SPACEDIM*bcr.size());

    for (int n = 0; n < bcr.size(); n++)
    {
        const int* b_rec = bcr[n].vect();

        for (int m = 0; m < 2*AMREX_SPACEDIM; m++)
        {
            bc[2*AMREX_SPACEDIM*n + m] = b_rec[m];
        }
    }

    return bc;
}